

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O2

gravity_parser_t * gravity_parser_create(char *source,size_t len,uint32_t fileid,_Bool is_static)

{
  gravity_parser_t *parser;
  gravity_lexer_t *pgVar1;
  lexer_r *plVar2;
  gravity_lexer_t **ppgVar3;
  gnode_r *pgVar4;
  
  if (init_grammer_rules_created == '\0') {
    rules[0x52].prefix = parse_parentheses_expression;
    rules[0x52].infix = parse_postfix_call;
    rules[0x52].precedence = PREC_CALL;
    rules[0x52].name = (char *)0x0;
    rules[0x52].right = false;
    rules[0x57].prefix = parse_list_expression;
    rules[0x57].infix = parse_postfix_subscript;
    rules[0x57].precedence = PREC_CALL;
    rules[0x57].name = (char *)0x0;
    rules[0x57].right = false;
    rules[0x55].prefix = parse_literal_expression;
    rules[0x55].infix = parse_postfix_access;
    rules[0x55].precedence = PREC_CALL;
    rules[0x55].name = (char *)0x0;
    rules[0x55].right = false;
    rules[0x59].prefix = parse_function_expression;
    rules[0x59].infix = (parse_func)0x0;
    rules[0x59].precedence = PREC_LOWEST;
    rules[0x59].name = (char *)0x0;
    rules[0x59].right = false;
    rules[8].prefix = parse_function_expression;
    rules[8].infix = (parse_func)0x0;
    rules[8].precedence = PREC_LOWEST;
    rules[8].name = (char *)0x0;
    rules[8].right = false;
    rules[5].prefix = parse_identifier_expression;
    rules[5].infix = (parse_func)0x0;
    rules[5].precedence = PREC_LOWEST;
    rules[5].name = (char *)0x0;
    rules[5].right = false;
    rules[3].prefix = parse_literal_expression;
    rules[3].infix = (parse_func)0x0;
    rules[3].precedence = PREC_LOWEST;
    rules[3].name = (char *)0x0;
    rules[3].right = false;
    rules[4].prefix = parse_literal_expression;
    rules[4].infix = (parse_func)0x0;
    rules[4].precedence = PREC_LOWEST;
    rules[4].name = (char *)0x0;
    rules[4].right = false;
    rules[0x28].prefix = parse_keyword_expression;
    rules[0x28].infix = (parse_func)0x0;
    rules[0x28].precedence = PREC_LOWEST;
    rules[0x28].name = (char *)0x0;
    rules[0x28].right = false;
    rules[0x2b].prefix = parse_keyword_expression;
    rules[0x2b].infix = (parse_func)0x0;
    rules[0x2b].precedence = PREC_LOWEST;
    rules[0x2b].name = (char *)0x0;
    rules[0x2b].right = false;
    rules[0x2a].prefix = parse_keyword_expression;
    rules[0x2a].infix = (parse_func)0x0;
    rules[0x2a].precedence = PREC_LOWEST;
    rules[0x2a].name = (char *)0x0;
    rules[0x2a].right = false;
    rules[9].prefix = parse_keyword_expression;
    rules[9].infix = (parse_func)0x0;
    rules[9].precedence = PREC_LOWEST;
    rules[9].name = (char *)0x0;
    rules[9].right = false;
    rules[0x1b].prefix = parse_file_expression;
    rules[0x1b].infix = (parse_func)0x0;
    rules[0x1b].precedence = PREC_LOWEST;
    rules[0x1b].name = (char *)0x0;
    rules[0x1b].right = false;
    rules[0x27].prefix = parse_keyword_expression;
    rules[0x27].infix = (parse_func)0x0;
    rules[0x27].precedence = PREC_LOWEST;
    rules[0x27].name = (char *)0x0;
    rules[0x27].right = false;
    rules[0xb].prefix = parse_keyword_expression;
    rules[0xb].infix = (parse_func)0x0;
    rules[0xb].precedence = PREC_LOWEST;
    rules[0xb].name = (char *)0x0;
    rules[0xb].right = false;
    rules[0xc].prefix = parse_keyword_expression;
    rules[0xc].infix = (parse_func)0x0;
    rules[0xc].precedence = PREC_LOWEST;
    rules[0xc].name = (char *)0x0;
    rules[0xc].right = false;
    rules[0x2c].prefix = (parse_func)0x0;
    rules[0x2c].infix = parse_infix;
    rules[0x2c].precedence = PREC_SHIFT;
    rules[0x2c].name = "<<";
    rules[0x2c].right = false;
    rules[0x2d].prefix = (parse_func)0x0;
    rules[0x2d].infix = parse_infix;
    rules[0x2d].precedence = PREC_SHIFT;
    rules[0x2d].name = ">>";
    rules[0x2d].right = false;
    rules[0x2e].prefix = (parse_func)0x0;
    rules[0x2e].infix = parse_infix;
    rules[0x2e].precedence = PREC_FACTOR;
    rules[0x2e].name = "*";
    rules[0x2e].right = false;
    rules[0x2f].prefix = (parse_func)0x0;
    rules[0x2f].infix = parse_infix;
    rules[0x2f].precedence = PREC_FACTOR;
    rules[0x2f].name = "/";
    rules[0x2f].right = false;
    rules[0x30].prefix = (parse_func)0x0;
    rules[0x30].infix = parse_infix;
    rules[0x30].precedence = PREC_FACTOR;
    rules[0x30].name = "%";
    rules[0x30].right = false;
    rules[0x31].prefix = (parse_func)0x0;
    rules[0x31].infix = parse_infix;
    rules[0x31].precedence = PREC_FACTOR;
    rules[0x31].name = "&";
    rules[0x31].right = false;
    rules[0x32].prefix = parse_unary;
    rules[0x32].infix = parse_infix;
    rules[0x32].precedence = PREC_TERM;
    rules[0x32].name = "+";
    rules[0x32].right = false;
    rules[0x33].prefix = parse_unary;
    rules[0x33].infix = parse_infix;
    rules[0x33].precedence = PREC_TERM;
    rules[0x33].name = "-";
    rules[0x33].right = false;
    rules[0x34].prefix = (parse_func)0x0;
    rules[0x34].infix = parse_infix;
    rules[0x34].precedence = PREC_TERM;
    rules[0x34].name = "|";
    rules[0x34].right = false;
    rules[0x35].prefix = (parse_func)0x0;
    rules[0x35].infix = parse_infix;
    rules[0x35].precedence = PREC_TERM;
    rules[0x35].name = "^";
    rules[0x35].right = false;
    rules[0x36].prefix = parse_unary;
    rules[0x36].infix = (parse_func)0x0;
    rules[0x36].precedence = PREC_LOWEST;
    rules[0x36].name = "~";
    rules[0x36].right = false;
    rules[0x37].prefix = (parse_func)0x0;
    rules[0x37].infix = parse_infix;
    rules[0x37].precedence = PREC_RANGE;
    rules[0x37].name = "..<";
    rules[0x37].right = false;
    rules[0x38].prefix = (parse_func)0x0;
    rules[0x38].infix = parse_infix;
    rules[0x38].precedence = PREC_RANGE;
    rules[0x38].name = "...";
    rules[0x38].right = false;
    rules[0x29].prefix = (parse_func)0x0;
    rules[0x29].infix = parse_infix;
    rules[0x29].precedence = PREC_ISA;
    rules[0x29].name = "is";
    rules[0x29].right = false;
    rules[0x39].prefix = (parse_func)0x0;
    rules[0x39].infix = parse_infix;
    rules[0x39].precedence = PREC_COMPARISON;
    rules[0x39].name = "<";
    rules[0x39].right = false;
    rules[0x3a].prefix = (parse_func)0x0;
    rules[0x3a].infix = parse_infix;
    rules[0x3a].precedence = PREC_COMPARISON;
    rules[0x3a].name = "<=";
    rules[0x3a].right = false;
    rules[0x3b].prefix = (parse_func)0x0;
    rules[0x3b].infix = parse_infix;
    rules[0x3b].precedence = PREC_COMPARISON;
    rules[0x3b].name = ">";
    rules[0x3b].right = false;
    rules[0x3c].prefix = (parse_func)0x0;
    rules[0x3c].infix = parse_infix;
    rules[0x3c].precedence = PREC_COMPARISON;
    rules[0x3c].name = ">=";
    rules[0x3c].right = false;
    rules[0x3d].prefix = (parse_func)0x0;
    rules[0x3d].infix = parse_infix;
    rules[0x3d].precedence = PREC_COMPARISON;
    rules[0x3d].name = "==";
    rules[0x3d].right = false;
    rules[0x3e].prefix = (parse_func)0x0;
    rules[0x3e].infix = parse_infix;
    rules[0x3e].precedence = PREC_COMPARISON;
    rules[0x3e].name = "!=";
    rules[0x3e].right = false;
    rules[0x3f].prefix = (parse_func)0x0;
    rules[0x3f].infix = parse_infix;
    rules[0x3f].precedence = PREC_COMPARISON;
    rules[0x3f].name = "===";
    rules[0x3f].right = false;
    rules[0x40].prefix = (parse_func)0x0;
    rules[0x40].infix = parse_infix;
    rules[0x40].precedence = PREC_COMPARISON;
    rules[0x40].name = "!==";
    rules[0x40].right = false;
    rules[0x41].prefix = (parse_func)0x0;
    rules[0x41].infix = parse_infix;
    rules[0x41].precedence = PREC_COMPARISON;
    rules[0x41].name = "~=";
    rules[0x41].right = false;
    rules[0x42].prefix = (parse_func)0x0;
    rules[0x42].infix = parse_infix;
    rules[0x42].precedence = PREC_LOGICAL_AND;
    rules[0x42].name = "&&";
    rules[0x42].right = true;
    rules[0x43].prefix = (parse_func)0x0;
    rules[0x43].infix = parse_infix;
    rules[0x43].precedence = PREC_LOGICAL_OR;
    rules[0x43].name = "||";
    rules[0x43].right = true;
    rules[0x44].prefix = (parse_func)0x0;
    rules[0x44].infix = parse_ternary_expression;
    rules[0x44].precedence = PREC_TERNARY;
    rules[0x44].name = (char *)0x0;
    rules[0x44].right = false;
    rules[0x45].prefix = (parse_func)0x0;
    rules[0x45].infix = parse_infix;
    rules[0x45].precedence = PREC_ASSIGN;
    rules[0x45].name = "=";
    rules[0x45].right = false;
    rules[0x46].prefix = (parse_func)0x0;
    rules[0x46].infix = parse_infix;
    rules[0x46].name = "*=";
    rules[0x46].right = false;
    rules[0x47].prefix = (parse_func)0x0;
    rules[0x47].infix = parse_infix;
    rules[0x47].name = "/=";
    rules[0x47].right = false;
    rules[0x48].prefix = (parse_func)0x0;
    rules[0x48].infix = parse_infix;
    rules[0x48].name = "%=";
    rules[0x48].right = false;
    rules[0x49].prefix = (parse_func)0x0;
    rules[0x49].infix = parse_infix;
    rules[0x49].name = "+=";
    rules[0x49].right = false;
    rules[0x4a].prefix = (parse_func)0x0;
    rules[0x4a].infix = parse_infix;
    rules[0x4a].name = "-=";
    rules[0x4a].right = false;
    rules[0x4b].prefix = (parse_func)0x0;
    rules[0x4b].infix = parse_infix;
    rules[0x4b].name = "<<=";
    rules[0x4b].right = false;
    rules[0x4c].prefix = (parse_func)0x0;
    rules[0x4c].infix = parse_infix;
    rules[0x4c].name = ">>=";
    rules[0x4c].right = false;
    rules[0x4d].prefix = (parse_func)0x0;
    rules[0x4d].infix = parse_infix;
    rules[0x4d].name = "=&";
    rules[0x4d].right = false;
    rules[0x4e].prefix = (parse_func)0x0;
    rules[0x4e].infix = parse_infix;
    rules[0x4e].name = "|=";
    rules[0x4e].right = false;
    rules[0x4f].prefix = (parse_func)0x0;
    rules[0x4f].infix = parse_infix;
    rules[0x4f].name = "^=";
    rules[0x4f].right = false;
    rules[0x50].prefix = parse_unary;
    rules[0x50].infix = (parse_func)0x0;
    rules[0x50].precedence = PREC_LOWEST;
    init_grammer_rules_created = '\x01';
    rules[0x50].name = "!";
    rules[0x50].right = false;
    rules[0x46].precedence = rules[0x45].precedence;
    rules[0x47].precedence = rules[0x45].precedence;
    rules[0x48].precedence = rules[0x45].precedence;
    rules[0x49].precedence = rules[0x45].precedence;
    rules[0x4a].precedence = rules[0x45].precedence;
    rules[0x4b].precedence = rules[0x45].precedence;
    rules[0x4c].precedence = rules[0x45].precedence;
    rules[0x4d].precedence = rules[0x45].precedence;
    rules[0x4e].precedence = rules[0x45].precedence;
    rules[0x4f].precedence = rules[0x45].precedence;
  }
  parser = (gravity_parser_t *)gravity_calloc((gravity_vm *)0x0,1,0x60);
  if (parser != (gravity_parser_t *)0x0) {
    pgVar1 = gravity_lexer_create(source,len,fileid,is_static);
    if (pgVar1 != (gravity_lexer_t *)0x0) {
      plVar2 = (lexer_r *)gravity_calloc((gravity_vm *)0x0,1,0x18);
      parser->lexer = plVar2;
      plVar2->m = 8;
      ppgVar3 = (gravity_lexer_t **)malloc(0x40);
      plVar2->p = ppgVar3;
      plVar2->n = 1;
      *ppgVar3 = pgVar1;
      pgVar4 = gnode_array_create();
      parser->statements = pgVar4;
      if (pgVar4 != (gnode_r *)0x0) {
        pgVar4 = gnode_array_create();
        parser->declarations = pgVar4;
        if (pgVar4 != (gnode_r *)0x0) {
          (parser->vdecl).n = 0;
          (parser->vdecl).m = 0;
          (parser->vdecl).p = (uint16_t *)0x0;
          parser->last_error_lineno = 0xffffffff;
          return parser;
        }
      }
    }
    gravity_parser_free(parser);
  }
  return (gravity_parser_t *)0x0;
}

Assistant:

gravity_parser_t *gravity_parser_create (const char *source, size_t len, uint32_t fileid, bool is_static) {
    init_grammer_rules();

    gravity_parser_t *parser = mem_alloc(NULL, sizeof(gravity_parser_t));
    if (!parser) return NULL;

    gravity_lexer_t *lexer = gravity_lexer_create(source, len, fileid, is_static);
    if (!lexer) goto abort_init;

    parser->lexer = mem_alloc(NULL, sizeof(lexer_r));
    marray_init(*parser->lexer);
    marray_push(gravity_lexer_t*, *parser->lexer, lexer);

    parser->statements = gnode_array_create();
    if (!parser->statements) goto abort_init;

    parser->declarations = gnode_array_create();
    if (!parser->declarations) goto abort_init;

    marray_init(parser->vdecl);
    
    parser->last_error_lineno = UINT32_MAX;
    return parser;

abort_init:
    gravity_parser_free(parser);
    return NULL;
}